

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
duckdb::IOException::IOException<unsigned_long,unsigned_long,unsigned_long,std::__cxx11::string>
          (IOException *this,string *msg,unsigned_long params,unsigned_long params_1,
          unsigned_long params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  local_70[0] = local_60;
  pcVar1 = (params_3->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + params_3->_M_string_length);
  Exception::ConstructMessage<unsigned_long,unsigned_long,unsigned_long,std::__cxx11::string>
            (&local_50,(Exception *)msg,(string *)params,params_1,params_2,(unsigned_long)local_70,
             in_stack_ffffffffffffff88);
  IOException(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return;
}

Assistant:

explicit IOException(const string &msg, ARGS... params) : IOException(ConstructMessage(msg, params...)) {
	}